

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O0

void __thiscall Am_MapIterator_Int2Str::Reset(Am_MapIterator_Int2Str *this)

{
  Am_MapIterator_Int2Str *this_local;
  
  this->m_key = 0;
  this->m_ass_pos = (Am_Assoc_Int2Str *)0x0;
  this->m_tbl_pos = -1;
  if (this->m_map != (Am_Map_Int2Str *)0x0) {
    NextTblEntry(this);
  }
  return;
}

Assistant:

AM_IMPL_MAP(Int2Str, int, 0, const char *, (0L))
#endif

//  This file contains code to time various functions in Amulet. It is used to
//  measure improvements and to make sure new features don't make Amulet
//  slower.

class timing_info
{
public:
  const char *name;
  unsigned long total_time;
  unsigned long cnt;
  float time_each;
};

int my_index = 0;
timing_info all_times[100];

void
print_summary()
{
  std::cout << "\n---------------------\nSummary (DEBUGGING "
#if defined DEBUG | defined _DEBUG
            << "on"
#else
            << "off"
#endif
            << "): \n";

  int i;
  for (i = 0; i < my_index; i++) {
    std::cout << i << ".  " << all_times[i].time_each << " msec per object for "
              << all_times[i].name << std::endl;
  }
  std::cout << std::flush;
}

// Two global Am_Time objects which store the time just before and after
// the test
Am_Time start_time;
Am_Time end_time;

// Get the actual time
void
start_timing()
{
  start_time = Am_Time::Now();
}

void
end_timing(const char *message, long cnt)
{
  // get the actual end time and calc the needed time
  end_time = Am_Time::Now();
  Am_Time total_time = end_time - start_time;

  // get the needed time in milliseconds
  unsigned long total_msec = total_time.Milliseconds();
  float time_each;

  // write the output separated by comma, so that we can read it into excel etc.
  std::cout << my_index << "," << message << "," << total_msec;

  // do we have a cnt value given? This value indicates, that we have
  // tested the timing several times
  if (cnt > 1) {
    // if so, calc the needed time per action and extrapolate it action/s
    time_each = static_cast<float>(total_msec) / static_cast<float>(cnt);

    float persec = 1000.0 / time_each;
    std::cout << "," << cnt << "," << time_each << "," << persec;
  } else {
    time_each = total_msec;
  }

  std::cout << std::endl;

  // save the timing for overall report
  all_times[my_index].name = message;
  all_times[my_index].total_time = total_msec;
  all_times[my_index].cnt = cnt;
  all_times[my_index].time_each = time_each;

  // increment the index
  if (my_index < 100) {
    my_index++;
  } else {
    //		std:cout << "To much tests!" << std::endl;
  }
}

Am_Slot_Key NEW_SLOT = Am_Register_Slot_Name("NEW_SLOT");
Am_Slot_Key MY_LEFT = Am_Register_Slot_Name("MY_LEFT");
Am_Slot_Key NEW_SLOT_INH = Am_Register_Slot_Name("NEW_SLOT_INH");
Am_Slot_Key NEW_SLOT_INH2 = Am_Register_Slot_Name("NEW_SLOT_INH2");
Am_Object win;

Am_Define_Formula(int, int_constraint)
{
  // get a slot-value, convert it to int and add a one
  return (static_cast<int>(self.Get(NEW_SLOT)) + 1);
}